

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeKernelSuggestMaxCooperativeGroupCount
          (ze_kernel_handle_t hKernel,uint32_t *totalGroupCount)

{
  ze_pfnKernelSuggestMaxCooperativeGroupCount_t pfnSuggestMaxCooperativeGroupCount;
  ze_result_t result;
  uint32_t *totalGroupCount_local;
  ze_kernel_handle_t hKernel_local;
  
  pfnSuggestMaxCooperativeGroupCount._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c6b0 != (code *)0x0) {
    pfnSuggestMaxCooperativeGroupCount._4_4_ = (*DAT_0011c6b0)(hKernel,totalGroupCount);
  }
  return pfnSuggestMaxCooperativeGroupCount._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSuggestMaxCooperativeGroupCount(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        uint32_t* totalGroupCount                       ///< [out] recommended total group count.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSuggestMaxCooperativeGroupCount = context.zeDdiTable.Kernel.pfnSuggestMaxCooperativeGroupCount;
        if( nullptr != pfnSuggestMaxCooperativeGroupCount )
        {
            result = pfnSuggestMaxCooperativeGroupCount( hKernel, totalGroupCount );
        }
        else
        {
            // generic implementation
        }

        return result;
    }